

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

void __thiscall
QPainter::drawText(QPainter *this,QPointF *p,QString *str,int tf,int justificationPadding)

{
  bool bVar1;
  PenStyle PVar2;
  int iVar3;
  QFixed other;
  pointer pQVar4;
  qsizetype qVar5;
  reference pQVar6;
  reference pvVar7;
  uchar *levels_00;
  int *visualOrder_00;
  QStackTextEngine *si_00;
  uint in_ECX;
  QTextEngine *in_RDX;
  QPointF *in_RSI;
  int in_R8D;
  long in_FS_OFFSET;
  qreal ypos;
  int j;
  QScriptItem *si;
  int item;
  int i_1;
  int i;
  int nItems;
  QPainterPrivate *d;
  QFixed x;
  QScriptLine line;
  QTextItemInt gf;
  QFont f;
  QVarLengthArray<unsigned_char,_256LL> levels;
  QVarLengthArray<int,_256LL> visualOrder;
  QStackTextEngine engine;
  QScriptItem *in_stack_ffffffffffffcf78;
  QStackTextEngine *in_stack_ffffffffffffcf80;
  QScriptItem *in_stack_ffffffffffffcf88;
  undefined4 in_stack_ffffffffffffcf90;
  undefined4 in_stack_ffffffffffffcf94;
  int numItems;
  undefined7 in_stack_ffffffffffffcfa0;
  value_type_conflict5 in_stack_ffffffffffffcfa7;
  QTextEngine *this_00;
  QTextEngine *this_01;
  int local_303c;
  int local_302c;
  int local_3028;
  QPointF local_2ff0;
  int local_2fdc;
  QFixed local_2fd8;
  QFixed local_2fd4 [2];
  undefined1 local_2fcc [20];
  int local_2fb8;
  uint local_2fa4;
  undefined1 local_2fa0 [16];
  QScriptLine *in_stack_ffffffffffffd070;
  QTextEngine *in_stack_ffffffffffffd078;
  undefined1 local_2f60 [8];
  QFixed local_2f58 [8];
  int local_2f38;
  QChar *local_2f30;
  unsigned_short *local_2f28;
  undefined1 auStack_2f18 [32];
  QTextEngine *in_stack_ffffffffffffd108;
  int local_2ef0;
  QVLABase<unsigned_char> local_2ed0 [11];
  QVLABase<int> local_2db8 [43];
  undefined1 local_29a0 [120];
  QTextEngine aQStack_2928 [39];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QPainter *)0x59dedc);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x59def2);
  if ((bVar1) && (bVar1 = QString::isEmpty((QString *)0x59df02), !bVar1)) {
    pen((QPainter *)in_stack_ffffffffffffcf80);
    PVar2 = QPen::style((QPen *)0x59df18);
    if (PVar2 != NoPen) {
      this_00 = in_RDX;
      std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x59df3a);
      QStackTextEngine::QStackTextEngine
                ((QStackTextEngine *)CONCAT44(in_stack_ffffffffffffcf94,in_stack_ffffffffffffcf90),
                 (QString *)in_stack_ffffffffffffcf88,(QFont *)in_stack_ffffffffffffcf80);
      this_01 = (QTextEngine *)(local_29a0 + 0x78);
      pQVar4 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                         ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x59df72
                         );
      QTextOption::setTextDirection((QTextOption *)this_01,pQVar4->layoutDirection);
      if ((in_ECX & 0x60000) != 0) {
        aQStack_2928[0].feCache.prevLength._0_1_ =
             (byte)aQStack_2928[0].feCache.prevLength & 0xfe | 1;
        QTextOption::setTextDirection
                  ((QTextOption *)(local_29a0 + 0x78),(uint)((in_ECX & 0x20000) == 0));
      }
      QTextEngine::itemize(in_stack_ffffffffffffd108);
      memset(local_2fcc,0xaa,0x2c);
      QScriptLine::QScriptLine((QScriptLine *)in_stack_ffffffffffffcf80);
      qVar5 = QString::size((QString *)in_RDX);
      local_2fa4 = local_2fa4 & 0xf0000000 | (uint)qVar5 & 0xfffffff;
      QTextEngine::shapeLine
                (this_00,(QScriptLine *)
                         CONCAT17(in_stack_ffffffffffffcfa7,in_stack_ffffffffffffcfa0));
      qVar5 = QList<QScriptItem>::size((QList<QScriptItem> *)aQStack_2928[0].text.d.d);
      iVar3 = (int)qVar5;
      memset(local_2db8,0xaa,0x418);
      QVarLengthArray<int,_256LL>::QVarLengthArray
                ((QVarLengthArray<int,_256LL> *)in_stack_ffffffffffffcf80,
                 (qsizetype)in_stack_ffffffffffffcf78);
      memset(local_2ed0,0xaa,0x118);
      QVarLengthArray<unsigned_char,_256LL>::QVarLengthArray
                ((QVarLengthArray<unsigned_char,_256LL> *)in_stack_ffffffffffffcf80,
                 (qsizetype)in_stack_ffffffffffffcf78);
      for (local_3028 = 0; local_3028 < iVar3; local_3028 = local_3028 + 1) {
        pQVar6 = QList<QScriptItem>::operator[]
                           ((QList<QScriptItem> *)in_stack_ffffffffffffcf80,
                            (qsizetype)in_stack_ffffffffffffcf78);
        in_stack_ffffffffffffcfa7 = SUB41(pQVar6->analysis,2);
        pvVar7 = QVLABase<unsigned_char>::operator[]
                           ((QVLABase<unsigned_char> *)in_stack_ffffffffffffcf78,0x59e0df);
        *pvVar7 = in_stack_ffffffffffffcfa7;
      }
      numItems = iVar3;
      levels_00 = QVLABase<unsigned_char>::data(local_2ed0);
      visualOrder_00 = QVLABase<int>::data(local_2db8);
      QTextEngine::bidiReorder(numItems,levels_00,visualOrder_00);
      if (0 < in_R8D) {
        in_stack_ffffffffffffcf88 = (QScriptItem *)(local_29a0 + 0x78);
        QFlags<Qt::AlignmentFlag>::QFlags
                  ((QFlags<Qt::AlignmentFlag> *)in_stack_ffffffffffffcf80,
                   (AlignmentFlag)((ulong)in_stack_ffffffffffffcf78 >> 0x20));
        QTextOption::setAlignment
                  ((QTextOption *)in_stack_ffffffffffffcf80,
                   (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                   SUB84((ulong)in_stack_ffffffffffffcf88 >> 0x20,0));
        aQStack_2928[0].feCache.prevLength._0_1_ =
             (byte)aQStack_2928[0].feCache.prevLength & 0xf7 | 8;
        QFixed::QFixed(local_2fd4,in_R8D);
        local_2fb8 = local_2fd4[0].val;
        QTextEngine::justify(in_stack_ffffffffffffd078,in_stack_ffffffffffffd070);
      }
      local_2fd8.val = -0x55555556;
      QPointF::x(in_RSI);
      local_2fd8 = QFixed::fromReal((qreal)in_stack_ffffffffffffcf78);
      for (local_302c = 0; local_302c < iVar3; local_302c = local_302c + 1) {
        QVLABase<int>::operator[]((QVLABase<int> *)in_stack_ffffffffffffcf78,0x59e1f9);
        si_00 = (QStackTextEngine *)
                QList<QScriptItem>::at
                          ((QList<QScriptItem> *)in_stack_ffffffffffffcf80,
                           (qsizetype)in_stack_ffffffffffffcf78);
        if (((uint)*(QScriptAnalysis *)
                    ((long)&((QVLABaseBase *)&(si_00->super_QTextEngine).lines)->a + 4) >> 8 & 0xf)
            < 7) {
          QTextEngine::font(this_01,(QScriptItem *)this_00);
          memset(local_2f60,0xaa,0x80);
          in_stack_ffffffffffffcf80 = si_00;
          QTextCharFormat::QTextCharFormat((QTextCharFormat *)0x59e2c9);
          QTextItemInt::QTextItemInt
                    ((QTextItemInt *)CONCAT44(numItems,in_stack_ffffffffffffcf90),
                     in_stack_ffffffffffffcf88,(QFont *)in_stack_ffffffffffffcf80,
                     (QTextCharFormat *)in_stack_ffffffffffffcf78);
          QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x59e2f8);
          QTextEngine::shapedGlyphs
                    (&in_stack_ffffffffffffcf80->super_QTextEngine,in_stack_ffffffffffffcf78);
          memcpy(auStack_2f18,local_2fa0,0x2c);
          local_2f30 = QString::unicode((QString *)0x59e341);
          local_2f30 = local_2f30 + (int)((QVLABaseBase *)&(si_00->super_QTextEngine).lines)->a;
          local_2f38 = QTextEngine::length((QTextEngine *)
                                           CONCAT17(in_stack_ffffffffffffcfa7,
                                                    in_stack_ffffffffffffcfa0),
                                           (int)((ulong)levels_00 >> 0x20));
          if (((byte)aQStack_2928[0].feCache.prevLength >> 3 & 1) == 0) {
            local_2f58[0].val =
                 *(int *)((QVLAStorage<4UL,_4UL,_256LL> *)&(si_00->super_QTextEngine).feCache)->
                         array;
          }
          else {
            for (local_303c = 0; local_303c < local_2ef0; local_303c = local_303c + 1) {
              other = QGlyphLayout::effectiveAdvance
                                ((QGlyphLayout *)CONCAT44(numItems,in_stack_ffffffffffffcf90),
                                 (int)((ulong)in_stack_ffffffffffffcf88 >> 0x20));
              QFixed::operator+=(local_2f58,other);
            }
          }
          local_2f28 = QTextEngine::logClusters((QTextEngine *)local_29a0,(QScriptItem *)si_00);
          in_stack_ffffffffffffcf78 = (QScriptItem *)QFixed::toReal(&local_2fd8);
          ypos = QPointF::y(in_RSI);
          QPointF::QPointF(&local_2ff0,(qreal)in_stack_ffffffffffffcf78,ypos);
          drawTextItem((QPainter *)CONCAT44(numItems,in_stack_ffffffffffffcf90),
                       (QPointF *)in_stack_ffffffffffffcf88,(QTextItem *)in_stack_ffffffffffffcf80);
          QFixed::operator+=(&local_2fd8,local_2f58[0]);
          QTextItemInt::~QTextItemInt((QTextItemInt *)0x59e47b);
          QFont::~QFont((QFont *)0x59e488);
        }
        else {
          local_2fdc = *(int *)((QVLAStorage<4UL,_4UL,_256LL> *)&(si_00->super_QTextEngine).feCache)
                               ->array;
          QFixed::operator+=(&local_2fd8,(QFixed)local_2fdc);
        }
      }
      QVarLengthArray<unsigned_char,_256LL>::~QVarLengthArray
                ((QVarLengthArray<unsigned_char,_256LL> *)in_stack_ffffffffffffcf80);
      QVarLengthArray<int,_256LL>::~QVarLengthArray
                ((QVarLengthArray<int,_256LL> *)in_stack_ffffffffffffcf80);
      QStackTextEngine::~QStackTextEngine(in_stack_ffffffffffffcf80);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::drawText(const QPointF &p, const QString &str, int tf, int justificationPadding)
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::drawText(), pos=[%.2f,%.2f], str='%s'\n", p.x(), p.y(), str.toLatin1().constData());
#endif

    Q_D(QPainter);

    if (!d->engine || str.isEmpty() || pen().style() == Qt::NoPen)
        return;

    Q_DECL_UNINITIALIZED QStackTextEngine engine(str, d->state->font);
    engine.option.setTextDirection(d->state->layoutDirection);
    if (tf & (Qt::TextForceLeftToRight|Qt::TextForceRightToLeft)) {
        engine.ignoreBidi = true;
        engine.option.setTextDirection((tf & Qt::TextForceLeftToRight) ? Qt::LeftToRight : Qt::RightToLeft);
    }
    engine.itemize();
    QScriptLine line;
    line.length = str.size();
    engine.shapeLine(line);

    int nItems = engine.layoutData->items.size();
    QVarLengthArray<int> visualOrder(nItems);
    QVarLengthArray<uchar> levels(nItems);
    for (int i = 0; i < nItems; ++i)
        levels[i] = engine.layoutData->items[i].analysis.bidiLevel;
    QTextEngine::bidiReorder(nItems, levels.data(), visualOrder.data());

    if (justificationPadding > 0) {
        engine.option.setAlignment(Qt::AlignJustify);
        engine.forceJustification = true;
        // this works because justify() is only interested in the difference between width and textWidth
        line.width = justificationPadding;
        engine.justify(line);
    }
    QFixed x = QFixed::fromReal(p.x());

    for (int i = 0; i < nItems; ++i) {
        int item = visualOrder[i];
        const QScriptItem &si = engine.layoutData->items.at(item);
        if (si.analysis.flags >= QScriptAnalysis::TabOrObject) {
            x += si.width;
            continue;
        }
        QFont f = engine.font(si);
        QTextItemInt gf(si, &f);
        gf.glyphs = engine.shapedGlyphs(&si);
        gf.chars = engine.layoutData->string.unicode() + si.position;
        gf.num_chars = engine.length(item);
        if (engine.forceJustification) {
            for (int j=0; j<gf.glyphs.numGlyphs; ++j)
                gf.width += gf.glyphs.effectiveAdvance(j);
        } else {
            gf.width = si.width;
        }
        gf.logClusters = engine.logClusters(&si);

        drawTextItem(QPointF(x.toReal(), p.y()), gf);

        x += gf.width;
    }
}